

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O0

void megumax::stats(Position *pos,UCTNode *node)

{
  bool bVar1;
  int iVar2;
  UCTNode *this;
  Position *pos_00;
  ostream *poVar3;
  UCTNode *this_00;
  ostream *poVar4;
  UCTNode *in_RSI;
  Position *in_RDI;
  double dVar5;
  bool is_expanded;
  long parent_relative_idx;
  UCTNode *parent;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  UCTNode *in_stack_ffffffffffffff40;
  vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *in_stack_ffffffffffffff50;
  string *psVar6;
  ostream *in_stack_ffffffffffffff78;
  Position *in_stack_ffffffffffffff80;
  int __val;
  string local_48 [16];
  UCTNode *in_stack_ffffffffffffffc8;
  Position *in_stack_ffffffffffffffd0;
  
  forward_position(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  libchess::Position::display(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this = UCTNode::parent(in_RSI);
  pos_00 = (Position *)std::operator<<((ostream *)&std::cout,"depth: ");
  iVar2 = UCTNode::depth(in_stack_ffffffffffffff40);
  poVar3 = (ostream *)std::ostream::operator<<(pos_00,iVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  this_00 = (UCTNode *)std::operator<<(poVar3,"visits: ");
  iVar2 = UCTNode::visits(in_RSI);
  poVar3 = (ostream *)std::ostream::operator<<(this_00,iVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"score: ");
  dVar5 = UCTNode::score(in_RSI);
  poVar4 = (ostream *)std::ostream::operator<<(poVar3,dVar5);
  __val = (int)((ulong)poVar3 >> 0x20);
  poVar3 = std::operator<<(poVar4,"\n");
  poVar3 = std::operator<<(poVar3,"P: ");
  dVar5 = UCTNode::p(this_00,pos_00);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Q: ");
  dVar5 = UCTNode::score(in_RSI);
  iVar2 = UCTNode::visits(in_RSI);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5 / (double)iVar2);
  std::operator<<(poVar3,"\n");
  if (this != (UCTNode *)0x0) {
    UCTNode::children(this);
    std::vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>::data
              ((vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *)0x127739);
    poVar3 = std::operator<<((ostream *)&std::cout,"U: ");
    dVar5 = UCTNode::child_probability
                      (in_stack_ffffffffffffff40,
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5);
    std::operator<<(poVar3,"\n");
  }
  bVar1 = UCTNode::is_terminal(in_RSI);
  if (!bVar1) {
    UCTNode::children(in_RSI);
    std::vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>::empty
              (in_stack_ffffffffffffff50);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"expanded: ");
  psVar6 = local_48;
  std::__cxx11::to_string(__val);
  poVar3 = std::operator<<(poVar3,psVar6);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_48);
  UCTNode::depth((UCTNode *)in_RDI);
  rewind_position(in_RDI,in_stack_ffffffffffffff3c);
  return;
}

Assistant:

void stats(Position& pos, UCTNode* node) {
    forward_position(pos, node);

    pos.display();
    UCTNode* parent = node->parent();
    std::cout << "depth: " << node->depth() << "\n"
              << "visits: " << node->visits() << "\n"
              << "score: " << node->score() << "\n"
              << "P: " << node->p(pos) << "\n"
              << "Q: " << node->score() / node->visits() << "\n";
    if (parent != nullptr) {
        auto parent_relative_idx = node - parent->children().data();
        std::cout << "U: " << parent->child_probability(parent_relative_idx) << "\n";
    }
    bool is_expanded = (!node->is_terminal() && !node->children().empty());
    std::cout << "expanded: " << std::to_string(is_expanded) << "\n";

    rewind_position(pos, node->depth());
}